

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::Const::Const(Const *this,Generator *generator,int64_t value,uint32_t width,bool is_signed)

{
  UserException *pUVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  args_2;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  string local_210;
  int64_t local_1f0;
  uint64_t unsigned_value;
  uint64_t max;
  string local_1d8;
  long local_1b8;
  int64_t min;
  uint64_t temp;
  ConstantLegal is_legal;
  string local_198;
  byte local_175;
  undefined1 local_174 [7];
  bool is_signed_local;
  uint32_t width_local;
  int64_t value_local;
  Generator *generator_local;
  Const *this_local;
  undefined8 local_150;
  basic_string_view<char> local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_unsigned_int>
  local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_unsigned_int>
  *local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_unsigned_int>
  *vargs;
  remove_reference_t<long_&> *local_f8;
  char (*local_f0) [60];
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_long,_unsigned_int>
  local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_long,_unsigned_int>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_long,_unsigned_int>
  *vargs_1;
  uint64_t *local_78;
  char (*local_70) [59];
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_unsigned_int>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_unsigned_int>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_long,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_long,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_long,_unsigned_int>
  *local_10;
  
  local_175 = is_signed;
  local_174._0_4_ = width;
  unique0x100002bd = value;
  value_local = (int64_t)generator;
  generator_local = (Generator *)this;
  std::__cxx11::to_string(&local_198,value);
  args_2._0_4_ = local_175 & 1;
  args_2._4_4_ = 0;
  Var::Var(&this->super_Var,generator,&local_198,local_174._0_4_,1,SUB41(args_2._0_4_,0),ConstValue)
  ;
  std::__cxx11::string::~string((string *)&local_198);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005d6898;
  this->value_ = 0;
  std::__cxx11::string::string((string *)&this->hex_value_);
  this->num_bits_ = 0;
  this->negative_ = false;
  temp._0_4_ = Const::is_legal(stack0xfffffffffffffe90,local_174._0_4_,(bool)(local_175 & 1));
  if ((ConstantLegal)temp == Small) {
    local_1b8 = -1L << (local_174[0] - 1 & 0x3f);
    max._7_1_ = 1;
    min = local_1b8;
    pUVar1 = (UserException *)__cxa_allocate_exception(0x10);
    local_e0 = &local_1d8;
    local_e8 = "{0} is smaller than the minimum value ({1}) given width {2}";
    local_f0 = (char (*) [60])(local_174 + 4);
    local_f8 = &local_1b8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_long,_unsigned_int>
             *)local_174;
    fmt::v7::make_args_checked<long&,long&,unsigned_int&,char[60],char>
              (&local_138,(v7 *)"{0} is smaller than the minimum value ({1}) given width {2}",
               local_f0,local_f8,(remove_reference_t<long_&> *)vargs,
               (remove_reference_t<unsigned_int_&> *)args_2.values_);
    local_108 = &local_138;
    local_148 = fmt::v7::to_string_view<char,_0>(local_e8);
    local_50 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_58 = local_108;
    local_48 = local_108;
    local_38 = local_108;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0x233,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_108);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = args_2.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = local_150;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_148.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_1d8,(detail *)local_148.data_,format_str,args);
    UserException::UserException(pUVar1,&local_1d8);
    max._7_1_ = 0;
    __cxa_throw(pUVar1,&UserException::typeinfo,UserException::~UserException);
  }
  if (((ConstantLegal)temp == Big) && ((uint)local_174._0_4_ < 0x41)) {
    unsigned_value = (1L << (local_174[0] & 0x3f)) - 1;
    local_1f0 = stack0xfffffffffffffe90;
    pUVar1 = (UserException *)__cxa_allocate_exception(0x10);
    local_60 = &local_210;
    local_68 = "{0} is larger than the maximum value ({1}) given width {2}";
    local_70 = (char (*) [59])(local_174 + 4);
    local_78 = &unsigned_value;
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long,_unsigned_long,_unsigned_int>
               *)local_174;
    fmt::v7::make_args_checked<long&,unsigned_long&,unsigned_int&,char[59],char>
              (&local_b8,(v7 *)"{0} is larger than the maximum value ({1}) given width {2}",local_70
               ,(remove_reference_t<long_&> *)local_78,
               (remove_reference_t<unsigned_long_&> *)vargs_1,
               (remove_reference_t<unsigned_int_&> *)args_2.values_);
    local_88 = &local_b8;
    local_c8 = fmt::v7::to_string_view<char,_0>(local_68);
    local_28 = &local_d8;
    local_30 = local_88;
    local_20 = local_88;
    local_10 = local_88;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x243,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_88);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = args_2.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_d8.field_1.values_;
    format_str_00.size_ = local_d8.desc_;
    format_str_00.data_ = (char *)local_c8.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_210,(detail *)local_c8.data_,format_str_00,args_00);
    UserException::UserException(pUVar1,&local_210);
    __cxa_throw(pUVar1,&UserException::typeinfo,UserException::~UserException);
  }
  this->value_ = stack0xfffffffffffffe90;
  return;
}

Assistant:

Const::Const(Generator *generator, int64_t value, uint32_t width, bool is_signed)
    : Var(generator, std::to_string(value), width, 1, is_signed, VarType::ConstValue), value_() {
    // need to deal with the signed value
    auto is_legal = Const::is_legal(value, width, is_signed);
    if (is_legal == ConstantLegal::Small) {
        uint64_t temp = (~0ull) << (width - 1);
        int64_t min = 0;
        std::memcpy(&min, &temp, sizeof(min));
        throw UserException(::format("{0} is smaller than the minimum value ({1}) given width {2}",
                                     value, min, width));
    } else if (is_legal == ConstantLegal::Big && width <= 64) {
        uint64_t max = (1ull << width) - 1;
        uint64_t unsigned_value;
        std::memcpy(&unsigned_value, &value, sizeof(unsigned_value));
        throw UserException(::format("{0} is larger than the maximum value ({1}) given width {2}",
                                     value, max, width));
    }
    value_ = value;
}